

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * QUtil::pdf_doc_to_utf8(string *__return_storage_ptr__,string *val)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  ulong uVar7;
  ulong uVar8;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = val->_M_string_length;
  if (uVar2 != 0) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      if (val->_M_string_length <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      bVar1 = (val->_M_dataplus)._M_p[uVar7];
      if ((byte)(bVar1 + 0x81) < 0x22) {
        uVar5 = bVar1 - 0x7f;
        puVar6 = pdf_doc_to_unicode;
LAB_00246fe4:
        uVar4 = puVar6[uVar5];
      }
      else {
        if ((bVar1 & 0xf8) == 0x18) {
          uVar5 = bVar1 - 0x18;
          puVar6 = pdf_doc_low_to_unicode;
          goto LAB_00246fe4;
        }
        uVar4 = (ushort)bVar1;
        if (bVar1 == 0xad) {
          uVar4 = 0xfffd;
        }
      }
      toUTF8_abi_cxx11_(&local_50,(QUtil *)(ulong)uVar4,val->_M_string_length);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = uVar8 < uVar2;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::pdf_doc_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if ((ch >= 127) && (ch <= 160)) {
            ch_short = pdf_doc_to_unicode[ch - 127];
        } else if ((ch >= 24) && (ch <= 31)) {
            ch_short = pdf_doc_low_to_unicode[ch - 24];
        } else if (ch == 173) {
            ch_short = 0xfffd;
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}